

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

GraphId absl::lts_20250127::DebugOnlyDeadlockCheck(Mutex *mu)

{
  OnDeadlockCycle OVar1;
  Mutex *mu_local;
  
  OVar1 = std::atomic<absl::lts_20250127::OnDeadlockCycle>::load
                    ((atomic<absl::lts_20250127::OnDeadlockCycle> *)
                     &(anonymous_namespace)::synch_deadlock_detection,memory_order_acquire);
  if (OVar1 == kIgnore) {
    mu_local = (Mutex *)synchronization_internal::InvalidGraphId();
  }
  else {
    mu_local = (Mutex *)DeadlockCheck(mu);
  }
  return (GraphId)(uint64_t)mu_local;
}

Assistant:

static inline GraphId DebugOnlyDeadlockCheck(Mutex* mu) {
  if (kDebugMode && synch_deadlock_detection.load(std::memory_order_acquire) !=
                        OnDeadlockCycle::kIgnore) {
    return DeadlockCheck(mu);
  } else {
    return InvalidGraphId();
  }
}